

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode socket_recv(UA_Connection *connection,UA_ByteString *response,UA_UInt32 timeout)

{
  int iVar1;
  UA_Byte *pUVar2;
  size_t sVar3;
  int *piVar4;
  ssize_t ret;
  ulong uStack_38;
  int ret_1;
  timeval tmptv;
  UA_UInt32 timeout_usec;
  UA_UInt32 timeout_local;
  UA_ByteString *response_local;
  UA_Connection *connection_local;
  
  tmptv.tv_usec._4_4_ = timeout;
  pUVar2 = (UA_Byte *)malloc((ulong)(connection->localConf).recvBufferSize);
  response->data = pUVar2;
  if (response->data == (UA_Byte *)0x0) {
    response->length = 0;
    connection_local._4_4_ = 0x80030000;
  }
  else {
    if (tmptv.tv_usec._4_4_ != 0) {
      tmptv.tv_usec._0_4_ = tmptv.tv_usec._4_4_ * 1000;
      uStack_38 = (ulong)(uint)tmptv.tv_usec / 1000000;
      tmptv.tv_sec = (ulong)(uint)tmptv.tv_usec % 1000000;
      iVar1 = setsockopt(connection->sockfd,1,0x14,&stack0xffffffffffffffc8,0x10);
      if (iVar1 != 0) {
        UA_ByteString_deleteMembers(response);
        socket_close(connection);
        return 0x80ae0000;
      }
    }
    sVar3 = recv(connection->sockfd,response->data,(ulong)(connection->localConf).recvBufferSize,0);
    if (sVar3 == 0) {
      UA_ByteString_deleteMembers(response);
      socket_close(connection);
      connection_local._4_4_ = 0x80ae0000;
    }
    else if ((long)sVar3 < 0) {
      UA_ByteString_deleteMembers(response);
      piVar4 = __errno_location();
      if (((*piVar4 == 4) || (tmptv.tv_usec._4_4_ != 0)) ||
         ((piVar4 = __errno_location(), *piVar4 != 0xb &&
          (piVar4 = __errno_location(), *piVar4 != 0xb)))) {
        socket_close(connection);
        connection_local._4_4_ = 0x80ae0000;
      }
      else {
        connection_local._4_4_ = 0;
      }
    }
    else {
      response->length = sVar3;
      connection_local._4_4_ = 0;
    }
  }
  return connection_local._4_4_;
}

Assistant:

static UA_StatusCode
socket_recv(UA_Connection *connection, UA_ByteString *response, UA_UInt32 timeout) {
    response->data = malloc(connection->localConf.recvBufferSize);
    if(!response->data) {
        response->length = 0;
        return UA_STATUSCODE_BADOUTOFMEMORY; /* not enough memory retry */
    }

    if(timeout > 0) {
        /* currently, only the client uses timeouts */
#ifndef _WIN32
        UA_UInt32 timeout_usec = timeout * 1000;
# ifdef __APPLE__
        struct timeval tmptv = {(long int)(timeout_usec / 1000000), timeout_usec % 1000000};
# else
        struct timeval tmptv = {(long int)(timeout_usec / 1000000), (long int)(timeout_usec % 1000000)};
# endif
        int ret = setsockopt(connection->sockfd, SOL_SOCKET, SO_RCVTIMEO,
                             (const char *)&tmptv, sizeof(struct timeval));
#else
        DWORD timeout_dw = timeout;
        int ret = setsockopt(connection->sockfd, SOL_SOCKET, SO_RCVTIMEO,
                             (const char*)&timeout_dw, sizeof(DWORD));
#endif
        if(0 != ret) {
            UA_ByteString_deleteMembers(response);
            socket_close(connection);
            return UA_STATUSCODE_BADCONNECTIONCLOSED;
        }
    }

#ifdef __CYGWIN__
    /* Workaround for https://cygwin.com/ml/cygwin/2013-07/msg00107.html */
    ssize_t ret;
    if(timeout > 0) {
        fd_set fdset;
        FD_ZERO(&fdset);
        UA_fd_set(connection->sockfd, &fdset);
        UA_UInt32 timeout_usec = timeout * 1000;
        struct timeval tmptv = {(long int)(timeout_usec / 1000000),
                                (long int)(timeout_usec % 1000000)};
        int retval = select(connection->sockfd+1, &fdset, NULL, NULL, &tmptv);
        if(retval && UA_fd_isset(connection->sockfd, &fdset)) {
            ret = recv(connection->sockfd, (char*)response->data,
                       connection->localConf.recvBufferSize, 0);
        } else {
            ret = 0;
        }
    } else {
        ret = recv(connection->sockfd, (char*)response->data,
                   connection->localConf.recvBufferSize, 0);
    }
#else
    ssize_t ret = recv(connection->sockfd, (char*)response->data,
                       connection->localConf.recvBufferSize, 0);
#endif

    /* server has closed the connection */
    if(ret == 0) {
        UA_ByteString_deleteMembers(response);
        socket_close(connection);
        return UA_STATUSCODE_BADCONNECTIONCLOSED;
    }

    /* error case */
    if(ret < 0) {
        UA_ByteString_deleteMembers(response);
        if(errno__ == INTERRUPTED || (timeout > 0) ?
           false : (errno__ == EAGAIN || errno__ == WOULDBLOCK))
            return UA_STATUSCODE_GOOD; /* statuscode_good but no data -> retry */
        socket_close(connection);
        return UA_STATUSCODE_BADCONNECTIONCLOSED;
    }
    
    /* default case */
    response->length = (size_t)ret;
    return UA_STATUSCODE_GOOD;
}